

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void el::LevelHelper::forEachLevel(EnumType *startIndex,function<bool_()> *fn)

{
  EnumType EVar1;
  bool bVar2;
  
  do {
    bVar2 = base::utils::std::function<bool_()>::operator()(fn);
    if (bVar2) {
      return;
    }
    EVar1 = *startIndex;
    *startIndex = EVar1 * 2;
  } while (EVar1 * 2 < 0x81);
  return;
}

Assistant:

void LevelHelper::forEachLevel(base::type::EnumType* startIndex, const std::function<bool(void)>& fn) {
  base::type::EnumType lIndexMax = LevelHelper::kMaxValid;
  do {
    if (fn()) {
      break;
    }
    *startIndex = static_cast<base::type::EnumType>(*startIndex << 1);
  } while (*startIndex <= lIndexMax);
}